

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O3

void st_tree::detail::
     node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
     ::_thread(node_type *n)

{
  size_type *psVar1;
  pointer ppnVar2;
  
  (n->
  super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
  )._size = 1;
  ppnVar2 = (n->
            super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
            )._children.
            super__Vector_base<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppnVar2 !=
      (n->
      super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
      )._children.
      super__Vector_base<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ((*ppnVar2)->
      super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
      )._parent = n;
      _thread(*ppnVar2);
      psVar1 = &(n->
                super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                )._size;
      *psVar1 = *psVar1 + ((*ppnVar2)->
                          super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                          )._size;
      ppnVar2 = ppnVar2 + 1;
    } while (ppnVar2 !=
             (n->
             super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
             )._children.
             super__Vector_base<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

static void _thread(node_type* n) {
        n->_size = 1;
        for (iterator j(n->begin());  j != n->end();  ++j) {
            j->_parent = n;
            node_type* c = &*j;
            _thread(c);
            n->_size += j->_size;
        }
    }